

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::EbmlElementSize(uint64 type,float param_2)

{
  int32 iVar1;
  uint64 in_RDI;
  uint64 ebml_size;
  
  iVar1 = GetUIntSize(in_RDI);
  return (long)iVar1 + 5;
}

Assistant:

uint64 EbmlElementSize(uint64 type, float /* value */) {
  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += sizeof(float);

  // Size of Datasize
  ebml_size++;

  return ebml_size;
}